

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,AssertBase *stmt)

{
  process_stmt(this,&stmt->super_Stmt);
  return;
}

Assistant:

void visit(AssertBase *stmt) override { process_stmt(stmt); }